

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  GetterXsYs<unsigned_short> *pGVar11;
  GetterXsYRef<unsigned_short> *pGVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  ImVec2 IVar15;
  ushort uVar16;
  bool bVar17;
  long lVar18;
  ImDrawIdx IVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  ImVec2 IVar26;
  float fVar27;
  ImVec2 IVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  pGVar11 = this->Getter1;
  pGVar12 = this->Getter2;
  iVar9 = pGVar11->Count;
  lVar18 = (long)(((pGVar11->Offset + prim + 1) % iVar9 + iVar9) % iVar9) * (long)pGVar11->Stride;
  iVar9 = this->Transformer->YAxis;
  dVar24 = (double)GImPlot->PixelRange[iVar9].Min.x;
  dVar7 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar21 = (float)(((double)*(ushort *)((long)pGVar11->Xs + lVar18) - dVar7) * GImPlot->Mx + dVar24)
  ;
  dVar25 = (double)GImPlot->PixelRange[iVar9].Min.y;
  dVar8 = GImPlot->CurrentPlot->YAxis[iVar9].Range.Min;
  fVar23 = (float)(((double)*(ushort *)((long)pGVar11->Ys + lVar18) - dVar8) * GImPlot->My[iVar9] +
                  dVar25);
  iVar10 = pGVar12->Count;
  fVar29 = (float)(((double)*(ushort *)
                             ((long)pGVar12->Xs +
                             (long)(((prim + 1 + pGVar12->Offset) % iVar10 + iVar10) % iVar10) *
                             (long)pGVar12->Stride) - dVar7) * GImPlot->Mx + dVar24);
  fVar30 = (float)((pGVar12->YRef - dVar8) * GImPlot->My[iVar9] + dVar25);
  fVar2 = (this->P11).x;
  fVar3 = (this->P12).x;
  fVar4 = (this->P11).y;
  fVar5 = (this->P12).y;
  fVar27 = fVar4;
  if (fVar5 <= fVar4) {
    fVar27 = fVar5;
  }
  if (fVar23 <= fVar27) {
    fVar27 = fVar23;
  }
  if (fVar30 <= fVar27) {
    fVar27 = fVar30;
  }
  bVar17 = false;
  if ((fVar27 < (cull_rect->Max).y) &&
     (fVar27 = (float)(~-(uint)(fVar5 <= fVar4) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar4) & (uint)fVar4), uVar20 = -(uint)(fVar23 <= fVar27),
     fVar27 = (float)(~uVar20 & (uint)fVar23 | uVar20 & (uint)fVar27),
     uVar20 = -(uint)(fVar30 <= fVar27),
     fVar27 = (float)(~uVar20 & (uint)fVar30 | uVar20 & (uint)fVar27), pfVar1 = &(cull_rect->Min).y,
     bVar17 = false, *pfVar1 <= fVar27 && fVar27 != *pfVar1)) {
    fVar27 = fVar2;
    if (fVar3 <= fVar2) {
      fVar27 = fVar3;
    }
    if (fVar21 <= fVar27) {
      fVar27 = fVar21;
    }
    if (fVar29 <= fVar27) {
      fVar27 = fVar29;
    }
    if (fVar27 < (cull_rect->Max).x) {
      fVar27 = (float)(~-(uint)(fVar3 <= fVar2) & (uint)fVar3 |
                      -(uint)(fVar3 <= fVar2) & (uint)fVar2);
      uVar20 = -(uint)(fVar21 <= fVar27);
      fVar27 = (float)(~uVar20 & (uint)fVar21 | uVar20 & (uint)fVar27);
      uVar20 = -(uint)(fVar29 <= fVar27);
      fVar27 = (float)(~uVar20 & (uint)fVar29 | uVar20 & (uint)fVar27);
      bVar17 = (cull_rect->Min).x <= fVar27 && fVar27 != (cull_rect->Min).x;
    }
  }
  IVar26.y = fVar23;
  IVar26.x = fVar21;
  IVar28.y = fVar30;
  IVar28.x = fVar29;
  if (bVar17 != false) {
    fVar27 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar32 = fVar2 * fVar23 - fVar21 * fVar4;
    fVar31 = fVar3 * fVar30 - fVar29 * fVar5;
    fVar22 = (fVar2 - fVar21) * (fVar5 - fVar30) - (fVar3 - fVar29) * (fVar4 - fVar23);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = this->Col;
    pIVar13[1].pos = IVar26;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = this->Col;
    IVar15.y = ((fVar5 - fVar30) * fVar32 - (fVar4 - fVar23) * fVar31) / fVar22;
    IVar15.x = (fVar32 * (fVar3 - fVar29) - (fVar2 - fVar21) * fVar31) / fVar22;
    pIVar13[2].pos = IVar15;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = this->Col;
    pIVar13[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = this->Col;
    pIVar13[4].pos = IVar28;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar13 + 5;
    uVar20 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar20;
    *pIVar14 = IVar19;
    uVar16 = -(ushort)(fVar6 < fVar27 && fVar23 < fVar30 || fVar27 < fVar6 && fVar30 < fVar23) & 1;
    pIVar14[1] = IVar19 + uVar16 + 1;
    pIVar14[2] = IVar19 + 3;
    pIVar14[3] = IVar19 + 1;
    pIVar14[4] = (uVar16 ^ 3) + IVar19;
    pIVar14[5] = IVar19 + 4;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar20 + 5;
  }
  this->P11 = IVar26;
  this->P12 = IVar28;
  return bVar17;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }